

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O1

void buffer_destroy(Buffer *buffer)

{
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  BufferBlock *pBVar2;
  BufferBlock *pBVar3;
  
  if (buffer == (Buffer *)0x0) {
    return;
  }
  UNRECOVERED_JUMPTABLE = buffer->f;
  pvVar1 = buffer->d;
  pBVar3 = buffer->head;
  while (pBVar3 != (BufferBlock *)0x0) {
    pBVar2 = pBVar3->next;
    (*buffer->f)(pBVar3,buffer->d);
    pBVar3 = pBVar2;
  }
  buffer->total_bytes = 0;
  buffer->head = (BufferBlock *)0x0;
  buffer->tail = (BufferBlock *)0x0;
  (*UNRECOVERED_JUMPTABLE)(buffer,pvVar1);
  return;
}

Assistant:

void buffer_destroy(Buffer *buffer)
{
    if (buffer != NULL)
    {
        MOJOSHADER_free f = buffer->f;
        void *d = buffer->d;
        buffer_empty(buffer);
        f(buffer, d);
    } // if
}